

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter_11.cpp
# Opt level: O2

void file_open_err(string *filename,FileType type)

{
  undefined8 extraout_RAX;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"Could not open \'",filename);
  std::operator+(&local_70,&local_30,"\' for ");
  __rhs = "writing";
  if (type == in) {
    __rhs = "reading";
  }
  std::operator+(&local_50,&local_70,__rhs);
  error(&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void file_open_err(const std::string& filename, FileType type)
{
	error("Could not open '"
		+ filename
		+ "' for "
		+ (type == FileType::in ? "reading" : "writing"));
}